

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.h
# Opt level: O0

int pstack::Procman::threadListCb<pstack::Procman::Process::getStacks[abi:cxx11]()::__1>
              (td_thrhandle_t *thr,void *v)

{
  anon_class_24_3_8a4df6fd *callback;
  void *v_local;
  td_thrhandle_t *thr_local;
  
  Process::getStacks::anon_class_24_3_8a4df6fd::operator()((anon_class_24_3_8a4df6fd *)v,thr);
  return 0;
}

Assistant:

int
threadListCb(const td_thrhandle_t *thr, void *v)
{ T &callback = *(T *)v; callback(thr); return 0; }